

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O3

string * __thiscall
google::protobuf::compiler::php::(anonymous_namespace)::GeneratedClassNameImpl_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,ServiceDescriptor *desc)

{
  long lVar1;
  long lVar2;
  long *plVar3;
  string *extraout_RAX;
  string *extraout_RAX_00;
  string *psVar4;
  size_type *psVar5;
  string classname;
  anon_unknown_2 *local_58;
  string *local_50;
  anon_unknown_2 local_48 [16];
  string local_38;
  
  lVar1 = **(long **)(this + 8);
  local_58 = local_48;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,lVar1,(*(long **)(this + 8))[1] + lVar1);
  plVar3 = (long *)(*(ulong *)(*(long *)(*(FileDescriptor **)(this + 0x10) + 0x78) + 0x78) &
                   0xfffffffffffffffe);
  lVar1 = plVar3[1];
  if (lVar1 == 0) {
    anon_unknown_2::ReservedNamePrefix
              (&local_38,local_58,local_50,*(FileDescriptor **)(this + 0x10));
  }
  else {
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    lVar2 = *plVar3;
    std::__cxx11::string::_M_construct<char*>((string *)&local_38,lVar2,lVar1 + lVar2);
  }
  plVar3 = (long *)std::__cxx11::string::_M_append((char *)&local_38,(ulong)local_58);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar5 = (size_type *)(plVar3 + 2);
  if ((size_type *)*plVar3 == psVar5) {
    lVar1 = plVar3[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar3;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
  }
  __return_storage_ptr__->_M_string_length = plVar3[1];
  *plVar3 = (long)psVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  psVar4 = (string *)&local_38.field_2;
  if ((string *)local_38._M_dataplus._M_p != psVar4) {
    operator_delete(local_38._M_dataplus._M_p);
    psVar4 = extraout_RAX;
  }
  if (local_58 != local_48) {
    operator_delete(local_58);
    psVar4 = extraout_RAX_00;
  }
  return psVar4;
}

Assistant:

std::string GeneratedClassNameImpl(const ServiceDescriptor* desc) {
  std::string classname = desc->name();
  return ClassNamePrefix(classname, desc) + classname;
}